

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonErrorFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  u32 uVar3;
  sqlite3 *pParse;
  uchar *puVar4;
  JsonParse *in_RDX;
  undefined4 in_ESI;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  u32 k;
  i64 iErrPos;
  JsonParse s;
  uint in_stack_ffffffffffffff88;
  uint uVar5;
  uint in_stack_ffffffffffffff8c;
  sqlite3_context *pCtx;
  undefined4 in_stack_ffffffffffffffa0;
  void *local_50;
  int local_48;
  u32 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  uint local_28;
  char local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCtx = (sqlite3_context *)0x0;
  memset(&local_50,0xaa,0x48);
  memset(&local_50,0,0x48);
  pParse = sqlite3_context_db_handle(in_RDI);
  iVar2 = jsonFuncArgMightBeBinary((sqlite3_value *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0));
  if (iVar2 == 0) {
    puVar4 = sqlite3_value_text((sqlite3_value *)0x22fb94);
    if (puVar4 == (uchar *)0x0) goto LAB_0022fc99;
    sqlite3_value_bytes((sqlite3_value *)0x22fbb3);
    iVar2 = jsonConvertTextToBlob(in_RDX,pCtx);
    if (iVar2 != 0) {
      if (local_21 == '\0') {
        in_stack_ffffffffffffff8c = 0;
        uVar5 = in_stack_ffffffffffffff88;
        while( true ) {
          in_stack_ffffffffffffff88 = uVar5 & 0xffffff;
          if (in_stack_ffffffffffffff8c < local_28) {
            in_stack_ffffffffffffff88 =
                 CONCAT13(puVar4[in_stack_ffffffffffffff8c] != '\0',(int3)uVar5);
          }
          if ((char)(in_stack_ffffffffffffff88 >> 0x18) == '\0') break;
          if (((int)(char)puVar4[in_stack_ffffffffffffff8c] & 0xc0U) != 0x80) {
            pCtx = (sqlite3_context *)((long)&pCtx->pOut + 1);
          }
          in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 1;
          uVar5 = in_stack_ffffffffffffff88;
        }
        pCtx = (sqlite3_context *)((long)&pCtx->pOut + 1);
      }
      else {
        pCtx = (sqlite3_context *)0xffffffffffffffff;
      }
    }
  }
  else {
    local_50 = sqlite3_value_blob((sqlite3_value *)in_RDX);
    local_48 = sqlite3_value_bytes((sqlite3_value *)0x22fb62);
    uVar3 = jsonbValidityCheck((JsonParse *)pParse,(u32)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                               (u32)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    pCtx = (sqlite3_context *)(ulong)uVar3;
  }
  jsonParseReset((JsonParse *)0x22fc76);
  if ((long)pCtx < 0) {
    sqlite3_result_error_nomem((sqlite3_context *)0x22fc88);
  }
  else {
    sqlite3_result_int64(pCtx,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
LAB_0022fc99:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void jsonErrorFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  i64 iErrPos = 0;       /* Error position to be returned */
  JsonParse s;

  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  memset(&s, 0, sizeof(s));
  s.db = sqlite3_context_db_handle(ctx);
  if( jsonFuncArgMightBeBinary(argv[0]) ){
    s.aBlob = (u8*)sqlite3_value_blob(argv[0]);
    s.nBlob = sqlite3_value_bytes(argv[0]);
    iErrPos = (i64)jsonbValidityCheck(&s, 0, s.nBlob, 1);
  }else{
    s.zJson = (char*)sqlite3_value_text(argv[0]);
    if( s.zJson==0 ) return;  /* NULL input or OOM */
    s.nJson = sqlite3_value_bytes(argv[0]);
    if( jsonConvertTextToBlob(&s,0) ){
      if( s.oom ){
        iErrPos = -1;
      }else{
        /* Convert byte-offset s.iErr into a character offset */
        u32 k;
        assert( s.zJson!=0 );  /* Because s.oom is false */
        for(k=0; k<s.iErr && ALWAYS(s.zJson[k]); k++){
          if( (s.zJson[k] & 0xc0)!=0x80 ) iErrPos++;
        }
        iErrPos++;
      }
    }
  }
  jsonParseReset(&s);
  if( iErrPos<0 ){
    sqlite3_result_error_nomem(ctx);
  }else{
    sqlite3_result_int64(ctx, iErrPos);
  }
}